

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O3

void __thiscall StackLattice_Join_Test::TestBody(StackLattice_Join_Test *this)

{
  initializer_list<wasm::analysis::Flat<unsigned_int>::Element> __l;
  initializer_list<wasm::analysis::Flat<unsigned_int>::Element> __l_00;
  initializer_list<wasm::analysis::Flat<unsigned_int>::Element> __l_01;
  _Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
  local_a8;
  undefined1 local_a4;
  undefined4 local_a0;
  undefined1 local_9c;
  _Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
  local_98;
  undefined1 local_94;
  undefined4 local_90;
  undefined1 local_8c;
  _Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
  local_88;
  undefined1 local_84;
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  local_80;
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  local_68;
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  local_50;
  Element local_38;
  Stack<wasm::analysis::Flat<unsigned_int>_> local_1c;
  allocator_type local_1b;
  allocator_type local_1a;
  allocator_type local_19 [5];
  Stack<wasm::analysis::Flat<unsigned_int>_> stack;
  
  local_38.
  super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = (_Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
              )0x0;
  local_84 = 1;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_88;
  std::
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::vector(&local_80,__l,&local_1b);
  local_a8 = (_Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
              )0x0;
  local_a4 = 1;
  local_a0 = 1;
  local_9c = 1;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_a8;
  std::
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::vector(&local_68,__l_00,&local_1a);
  local_98 = (_Variadic_union<wasm::analysis::Flat<unsigned_int>::Bot,_unsigned_int,_wasm::analysis::Flat<unsigned_int>::Top>
              )0x0;
  local_94 = 1;
  local_8c = 2;
  local_90 = 0;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_98;
  std::
  vector<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
  ::vector(&local_50,__l_01,local_19);
  testDiamondJoin<wasm::analysis::Stack<wasm::analysis::Flat<unsigned_int>>>
            (&local_1c,&local_38,&local_80,&local_68,&local_50);
  if (local_50.
      super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.
      super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.
      super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38.
      super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<wasm::analysis::Flat<unsigned_int>::Element,_std::allocator<wasm::analysis::Flat<unsigned_int>::Element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(StackLattice, Join) {
  analysis::Stack stack{analysis::Flat<uint32_t>{}};
  auto& flat = stack.lattice;
  testDiamondJoin(stack,
                  {},
                  {flat.get(0)},
                  {flat.get(0), flat.get(1)},
                  {flat.get(0), flat.getTop()});
}